

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O2

PointAttribute * __thiscall
draco::PointCloud::GetAttributeByUniqueId(PointCloud *this,uint32_t unique_id)

{
  int32_t iVar1;
  _Head_base<0UL,_draco::PointAttribute_*,_false> _Var2;
  
  iVar1 = GetAttributeIdByUniqueId(this,unique_id);
  if (iVar1 == -1) {
    _Var2._M_head_impl = (PointAttribute *)0x0;
  }
  else {
    _Var2._M_head_impl =
         *(PointAttribute **)
          &(this->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar1]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t;
  }
  return _Var2._M_head_impl;
}

Assistant:

const PointAttribute *PointCloud::GetAttributeByUniqueId(
    uint32_t unique_id) const {
  const int32_t att_id = GetAttributeIdByUniqueId(unique_id);
  if (att_id == -1) {
    return nullptr;
  }
  return attributes_[att_id].get();
}